

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

int socketsys::UnixProvider::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int extraout_EAX;
  SocketBindException *this;
  int *piVar2;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar3;
  addrinfo *res;
  socklen_t length;
  int type;
  socklen_t size;
  array<char,_6UL> portBuffer;
  sockaddr data;
  addrinfo local_68;
  
  portBuffer._M_elems[4] = '\0';
  portBuffer._M_elems[5] = '\0';
  portBuffer._M_elems[0] = '\0';
  portBuffer._M_elems[1] = '\0';
  portBuffer._M_elems[2] = '\0';
  portBuffer._M_elems[3] = '\0';
  sprintf(portBuffer._M_elems,"%d",CONCAT44(in_register_00000014,__len));
  data.sa_family = 0;
  data.sa_data[0] = '\0';
  data.sa_data[1] = '\0';
  data.sa_data[2] = '\0';
  data.sa_data[3] = '\0';
  data.sa_data[4] = '\0';
  data.sa_data[5] = '\0';
  data.sa_data[6] = '\0';
  data.sa_data[7] = '\0';
  data.sa_data[8] = '\0';
  data.sa_data[9] = '\0';
  data.sa_data[10] = '\0';
  data.sa_data[0xb] = '\0';
  data.sa_data[0xc] = '\0';
  data.sa_data[0xd] = '\0';
  size = 0x10;
  getsockname(__fd,(sockaddr *)&data,&size);
  length = 4;
  getsockopt(__fd,1,3,&type,&length);
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68._0_8_ = (data._0_8_ & 0xffff) << 0x20;
  local_68.ai_protocol = 0x11;
  if (type == 1) {
    local_68.ai_protocol = 6;
  }
  local_68.ai_socktype = type;
  iVar1 = getaddrinfo(*(char **)(__addr->sa_data + 6),portBuffer._M_elems,&local_68,
                      (addrinfo **)&res);
  if (iVar1 == 0) {
    iVar1 = ::connect(__fd,(sockaddr *)res->ai_addr,res->ai_addrlen);
    freeaddrinfo((addrinfo *)res);
    if (iVar1 != -1) {
      return extraout_EAX;
    }
    this = (SocketBindException *)__cxa_allocate_exception(0x10);
    piVar2 = __errno_location();
    SocketBindException::SocketBindException(this,"Linux failed to connect socket ",*piVar2);
    ppuVar3 = &SocketBindException::typeinfo;
  }
  else {
    this = (SocketBindException *)__cxa_allocate_exception(0x10);
    NameResolveException::NameResolveException
              ((NameResolveException *)this,"Linux failed to resolve address ",iVar1);
    ppuVar3 = &NameResolveException::typeinfo;
  }
  __cxa_throw(this,ppuVar3,std::runtime_error::~runtime_error);
}

Assistant:

void UnixProvider::connect(SocketHandle handle, const std::string_view& address, uint16_t port) {
    std::array<char, 6> portBuffer{};
    sprintf(portBuffer.data(), "%d", port);

    sockaddr data{};
    socklen_t size = sizeof(sockaddr);
    getsockname(handle, &data, &size);

    int type;
    socklen_t length = sizeof(int);
    getsockopt(handle, SOL_SOCKET, SO_TYPE, &type, &length);

    addrinfo hints {
            {},
            data.sa_family,
            type,
            type == SOCK_STREAM ? IPPROTO_TCP : IPPROTO_UDP,
    };

    addrinfo* res;
    auto result = getaddrinfo(address.data(), portBuffer.data(), &hints, &res);
    if (result != 0) {
        throw NameResolveException("Linux failed to resolve address ", result);
    }

    result = ::connect(handle, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);

    if (result == -1) {
        throw SocketBindException("Linux failed to connect socket ", errno);
    }
}